

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O3

SListLeaf *
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListLeaf::assimilate
          (Leaf *orig)

{
  int *piVar1;
  SListLeaf *this;
  void **head;
  LDIterator local_20;
  
  this = (SListLeaf *)
         Lib::FixedSizeAllocator<32UL>::alloc
                   ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  SListLeaf(this,(TermList)(orig->super_Node)._term._content);
  (*(orig->super_Node)._vptr_Node[8])(&local_20,orig);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Leaf::loadChildren
            ((Leaf *)this,&local_20);
  if (local_20._core != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0) {
    piVar1 = &(local_20._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_20._core)->_vptr_IteratorCore[1])();
    }
  }
  (*(orig->super_Node)._vptr_Node[6])(orig);
  (*(orig->super_Node)._vptr_Node[1])(orig);
  return this;
}

Assistant:

typename SubstitutionTree<LeafData_>::SListLeaf* SubstitutionTree<LeafData_>::SListLeaf::assimilate(Leaf* orig)
{
  SListLeaf* res=new SListLeaf(orig->term());
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  delete orig;
  return res;
}